

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O0

void __thiscall CDesign::Report(CDesign *this,char *pName)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  double dVar9;
  char local_418 [8];
  char cCmd [512];
  char cName [512];
  char *pName_local;
  CDesign *this_local;
  
  sVar8 = strlen(&(this->super_CBBox).field_0x14);
  if (5 < sVar8) {
    sprintf(cCmd + 0x1f8,">%s.rpt",&this->field_0x634);
    CObject::PrintFile(&this->super_CObject,cCmd + 0x1f8,0);
    CObject::PrintFile(&this->super_CObject,cCmd + 0x1f8,0x20);
    sprintf(local_418,"cat %s >> %s",cCmd + 0x1f9,&this->field_0x634);
    system(local_418);
    uVar1 = this->m_iBestOF;
    uVar2 = this->m_iBestWL;
    iVar3 = this->m_iBestVia;
    iVar4 = this->m_iBestWL;
    iVar5 = this->m_iBestVia;
    iVar6 = *(int *)&this->field_0xc34;
    dVar9 = StopWatch(0);
    iVar7 = GetMemory();
    sprintf(local_418,"mail %s -s \"%s OF=%d WL:%d VIA:%d=%d in %.1f sec (%.1f MB)\" < %s",dVar9,
            (double)iVar7 / 1024.0,&(this->super_CBBox).field_0x14,pName,(ulong)uVar1,(ulong)uVar2,
            iVar3,iVar4 + iVar5 * iVar6,cCmd + 0x1f9);
    system(local_418);
    CObject::Display(4,"%s\n",local_418);
  }
  return;
}

Assistant:

void CDesign::Report(char* pName)
{
	if(strlen(m_Param.m_cEmail)>5)
	{
		char	cName[MAX_BUFFER_STR];
		sprintf(cName,">%s.rpt",m_Param.m_cOutput_File);

		PrintFile(cName,PRINT_MODE_TEXT);
		PrintFile(cName,PRINT_MODE_CONGET);

		char	cCmd[MAX_BUFFER_STR];
		sprintf(cCmd,"cat %s >> %s",cName+1,m_Param.m_cOutput_File);
		system(cCmd);

		sprintf(cCmd,"mail %s -s \"%s OF=%d WL:%d VIA:%d=%d in %.1f sec (%.1f MB)\" < %s",
			m_Param.m_cEmail,pName,m_iBestOF,m_iBestWL,m_iBestVia,
			m_iBestWL+m_iBestVia*m_Param.m_iViaCost,			
			StopWatch(STOPWATCH_OPTION_SET),GetMemory()/1024.0,cName+1);
#ifndef WIN32
		system(cCmd);
#endif
		Display(DISPLAY_MODE_EXEC,"%s\n",cCmd);
	}
}